

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlobIOSystem.h
# Opt level: O2

void __thiscall
Assimp::BlobIOStream::BlobIOStream
          (BlobIOStream *this,BlobIOSystem *creator,string *file,size_t initial)

{
  (this->super_IOStream)._vptr_IOStream = (_func_int **)&PTR__BlobIOStream_00758260;
  this->buffer = (uint8_t *)0x0;
  this->cur_size = 0;
  this->file_size = 0;
  this->cursor = 0;
  this->initial = initial;
  std::__cxx11::string::string((string *)&this->file,(string *)file);
  this->creator = creator;
  return;
}

Assistant:

BlobIOStream(BlobIOSystem* creator, const std::string& file, size_t initial = 4096)
        : buffer()
        , cur_size()
        , file_size()
        , cursor()
        , initial(initial)
        , file(file)
        , creator(creator)
    {
    }